

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O0

void __thiscall LiteScript::State::AddInstruction(State *this,Instruction *in)

{
  uint uVar1;
  size_type sVar2;
  reference pvVar3;
  vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_> local_38;
  Instruction *local_18;
  Instruction *in_local;
  State *this_local;
  
  local_18 = in;
  in_local = (Instruction *)this;
  sVar2 = std::
          vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
          ::size(&this->instr);
  if (sVar2 == 0) {
    local_38.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.super__Vector_base<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::vector
              (&local_38);
    std::
    vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
    ::push_back(&this->instr,&local_38);
    std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::~vector
              (&local_38);
  }
  uVar1 = this->instr_index;
  sVar2 = std::
          vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
          ::size(&this->instr);
  if (sVar2 <= uVar1) {
    sVar2 = std::
            vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
            ::size(&this->instr);
    this->instr_index = (int)sVar2 - 1;
    pvVar3 = std::
             vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
             ::operator[](&this->instr,(ulong)this->instr_index);
    sVar2 = std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::size
                      (pvVar3);
    this->line_num = (uint)sVar2;
  }
  pvVar3 = std::
           vector<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>,_std::allocator<std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>_>_>
           ::operator[](&this->instr,(ulong)this->instr_index);
  std::vector<LiteScript::Instruction,_std::allocator<LiteScript::Instruction>_>::push_back
            (pvVar3,local_18);
  return;
}

Assistant:

void LiteScript::State::AddInstruction(const Instruction &in) {
    if (this->instr.size() == 0)
        this->instr.push_back(std::vector<Instruction>());
    if (this->instr_index >= this->instr.size()) {
        this->instr_index = this->instr.size() - 1;
        this->line_num = this->instr[this->instr_index].size();
    }
    this->instr[this->instr_index].push_back(in);
}